

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * __thiscall
FastPForLib::__fastpackwithoutmask14_32(FastPForLib *this,uint32_t *in,uint32_t *out)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  long unaff_RBP;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  
  vpmovsxbd_avx2(ZEXT816(0x483c342c24181008));
  auVar5 = vpmovsxbd_avx(ZEXT416(0x2000804));
  auVar9 = vpgatherdd_avx512vl(*(undefined4 *)(this + (uint)(*(int *)(this + 0x1c) << 2)));
  auVar8 = vpinsrd_avx(auVar9._0_16_,*(int *)(this + 0x1c) << 2,2);
  auVar6 = vpsrlvd_avx2(auVar9._0_16_,auVar5);
  iVar2 = *(int *)(this + 0x5c);
  auVar7 = vpinsrd_avx(auVar5,auVar9._8_4_ >> 0xc,2);
  auVar8 = vpor_avx(auVar8,auVar7);
  auVar12._8_8_ = 0xa00000006;
  auVar12._0_8_ = 0xa00000006;
  auVar8 = vpblendd_avx2(auVar6,auVar8,4);
  vpmovsxbd_avx2(ZEXT816(0x4438302820140c04));
  auVar10 = valignd_avx512vl(ZEXT1632(auVar8),ZEXT1632(auVar8),7);
  auVar8 = vpshufd_avx(auVar12,0x50);
  auVar11 = vpgatherdd_avx512vl(*(undefined4 *)(this + unaff_RBP));
  auVar11 = vpsllvd_avx2(auVar11,_DAT_0018f9a0);
  auVar10 = vpblendd_avx2(auVar10,ZEXT432(*(uint *)this),1);
  auVar7 = vpshufd_avx(auVar9._16_16_,0x50);
  auVar8 = vpsrlvd_avx2(auVar7,auVar8);
  auVar13._0_16_ = ZEXT116(0) * auVar8 + ZEXT116(1) * auVar10._0_16_;
  auVar13._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar8;
  auVar10 = vpblendd_avx2(auVar10,auVar13,0x60);
  uVar1 = *(undefined4 *)(this + 0x40);
  auVar14._4_4_ = uVar1;
  auVar14._0_4_ = uVar1;
  auVar14._8_4_ = uVar1;
  auVar14._12_4_ = uVar1;
  auVar14._16_4_ = uVar1;
  auVar14._20_4_ = uVar1;
  auVar14._24_4_ = uVar1;
  auVar14._28_4_ = uVar1;
  auVar10 = vpblendd_avx2(auVar10,auVar14,0x80);
  auVar13 = vpsllvd_avx2(auVar9,_DAT_0018f9e0);
  auVar10 = vpternlogd_avx512vl(auVar13,auVar11,auVar10,0xfe);
  vpmovsxbd_avx(ZEXT416(0x6c645850));
  *(undefined1 (*) [32])in = auVar10;
  auVar6 = vpgatherdd_avx512vl(*(undefined4 *)(this + (uint)(iVar2 << 2)));
  auVar7 = vpmovsxbd_avx(ZEXT416(0x202000f));
  auVar8 = vpinsrd_avx(auVar5,auVar6._4_4_ >> 0xc,2);
  auVar10 = vpermi2d_avx512vl(ZEXT1632(auVar7),ZEXT1632(auVar6),auVar9);
  auVar7 = vpinsrd_avx(auVar10._0_16_,iVar2 << 2,2);
  auVar5 = vpsrlvd_avx2(auVar10._0_16_,auVar5);
  uVar3 = *(uint *)(this + 0x74);
  auVar8 = vpor_avx(auVar7,auVar8);
  auVar8 = vpblendd_avx2(auVar5,auVar8,4);
  vpmovsxbd_avx(ZEXT416(0x6860544c));
  auVar7 = vpgatherdd_avx512vl(*(undefined4 *)(this + (long)out));
  auVar7 = vpsllvd_avx2(auVar7,_DAT_00192fe0);
  auVar5 = vpsllvd_avx2(auVar6,_DAT_00193000);
  auVar8 = vpternlogd_avx512vl(auVar5,auVar7,auVar8,0xfe);
  uVar4 = *(uint *)(this + 0x70);
  auVar7 = vpshufd_avx(auVar6,0xff);
  *(undefined1 (*) [16])(in + 8) = auVar8;
  auVar8 = vpinsrd_avx(ZEXT416(uVar3),*(undefined4 *)(this + 0x7c),1);
  auVar7 = vpinsrd_avx(auVar7,uVar3,1);
  auVar5 = vpsllvd_avx2(auVar8,_DAT_00193020);
  auVar7 = vpsrlvd_avx2(auVar7,auVar12);
  auVar8 = vpinsrd_avx(ZEXT416(uVar4),*(undefined4 *)(this + 0x78),1);
  auVar8 = vpsllvd_avx2(auVar8,_DAT_00193010);
  auVar8 = vpternlogd_avx512vl(auVar5,auVar8,auVar7,0xfe);
  *(long *)(in + 0xc) = auVar8._0_8_;
  return in + 0xe;
}

Assistant:

uint32_t *__fastpackwithoutmask14_32(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (14 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (14 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (14 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (14 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (14 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (14 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (14 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (14 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (14 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (14 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (14 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (14 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  ++in;

  return out;
}